

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall Connection::Connection(Connection *this,short port)

{
  int iVar1;
  hostent *phVar2;
  char *pcVar3;
  string *psVar4;
  char *pcVar5;
  sockaddr local_68;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  iVar1 = socket(2,1,0);
  this->sock = iVar1;
  if (iVar1 < 0) {
    local_38[0] = local_28;
    pcVar5 = "socket() failed";
    pcVar3 = "";
    psVar4 = (string *)local_38;
  }
  else {
    local_68.sa_data[10] = '\0';
    local_68.sa_data[0xb] = '\0';
    local_68.sa_data[0xc] = '\0';
    local_68.sa_data[0xd] = '\0';
    local_68.sa_data[2] = '\0';
    local_68.sa_data[3] = '\0';
    local_68.sa_data[4] = '\0';
    local_68.sa_data[5] = '\0';
    local_68.sa_data[6] = '\0';
    local_68.sa_data[7] = '\0';
    local_68.sa_data[8] = '\0';
    local_68.sa_data[9] = '\0';
    local_68.sa_family = 2;
    local_68.sa_data._0_2_ = port << 8 | (ushort)port >> 8;
    phVar2 = gethostbyname("localhost");
    memcpy(local_68.sa_data + 2,*phVar2->h_addr_list,(long)phVar2->h_length);
    iVar1 = connect(this->sock,&local_68,0x10);
    if (-1 < iVar1) {
      return;
    }
    local_58[0] = local_48;
    pcVar5 = "connect() failed";
    pcVar3 = "";
    psVar4 = (string *)local_58;
  }
  std::__cxx11::string::_M_construct<char_const*>(psVar4,pcVar5,pcVar3);
  puts(*(char **)psVar4);
  exit(-1);
}

Assistant:

Connection::Connection(short port) {
#if defined(__linux__) || defined(__APPLE__)
  struct sockaddr_in echoServAddr; /* Echo server address */
  struct  hostent  *ptrh;
  
  /* Create a reliable, stream socket using TCP */
  if ((sock = socket(AF_INET, SOCK_STREAM, 0)) < 0)
    myerror("socket() failed");
  
  /* Construct the server address structure */
  memset(&echoServAddr, 0, sizeof(echoServAddr));     /* Zero out structure */
  echoServAddr.sin_family      = AF_INET;             /* Internet address family */
  echoServAddr.sin_port = htons(port);                /* Server port */

  ptrh = gethostbyname("localhost");

  memcpy(&echoServAddr.sin_addr, ptrh->h_addr, ptrh->h_length);
  
  /* Establish the connection to the echo server */
  if (connect(sock, (struct sockaddr *) &echoServAddr, sizeof(echoServAddr)) < 0)
    myerror("connect() failed");
#else
		WSADATA wsaData;
    int iResult = WSAStartup(MAKEWORD(2,2), &wsaData);
    if (iResult != NO_ERROR)
				printf("Client: Error at WSAStartup().\n");

	// Create a socket.
    sock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
    if (sock == INVALID_SOCKET) {
        printf("Client: socket() - Error at socket(): %d\n", WSAGetLastError());
        WSACleanup();
    }

    // Connect to a server.
    sockaddr_in clientService;
    clientService.sin_family = AF_INET;
    // Just test using the localhost, you can try other IP address
    clientService.sin_addr.s_addr = inet_addr("127.0.0.1");
    clientService.sin_port = htons(port);

    if (connect(sock, (SOCKADDR*)&clientService, sizeof(clientService)) == SOCKET_ERROR) {
        printf("Client: connect() - Failed to connect.\n");
        WSACleanup();
    }
#endif
}